

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
get_best(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this,
        int *constraints_remaining,double *value,double *duration,long *loop)

{
  int iVar1;
  pointer prVar2;
  m_indices_reader lock;
  shared_lock<std::shared_mutex> local_38;
  
  local_38._M_owns = true;
  local_38._M_pm = &this->m_indices_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  prVar2 = (this->m_data).
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = *(this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *constraints_remaining = prVar2[iVar1].remaining_constraints;
  *value = prVar2[iVar1].value;
  *duration = prVar2[iVar1].duration;
  *loop = prVar2[iVar1].loop;
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_38);
  return;
}

Assistant:

void get_best(int& constraints_remaining,
                  double& value,
                  double& duration,
                  long int& loop) const noexcept
    {
        m_indices_reader lock(m_indices_mutex);
        int id = m_indices.front();

        constraints_remaining = m_data[id].remaining_constraints;
        value = m_data[id].value;
        duration = m_data[id].duration;
        loop = m_data[id].loop;
    }